

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O2

ByteString * __thiscall ByteString::operator+=(ByteString *this,uchar byte)

{
  uchar local_9;
  
  local_9 = byte;
  std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::push_back(&this->byteString,&local_9)
  ;
  return this;
}

Assistant:

ByteString& ByteString::operator+=(const unsigned char byte)
{
	byteString.push_back(byte);

	return *this;
}